

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SAT2FO.cpp
# Opt level: O1

void __thiscall SAT::SAT2FO::collectAssignment(SAT2FO *this,SATSolver *solver,LiteralStack *res)

{
  uint uVar1;
  int iVar2;
  Literal *pLVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  bool bVar7;
  
  uVar1 = (this->_posMap)._nextNum;
  uVar4 = 0;
  uVar5 = uVar1 - 1;
  bVar7 = uVar5 != 0;
  if (uVar1 == 0) {
    uVar5 = 0;
  }
  if (uVar1 != 0 && bVar7) {
    iVar6 = 2;
    do {
      uVar4 = uVar4 + 1;
      iVar2 = (*solver->_vptr_SATSolver[6])(solver,(ulong)uVar4);
      if (iVar2 != 2) {
        pLVar3 = toFO(this,(SATLiteral)(iVar6 + (uint)(iVar2 == 0)));
        if (pLVar3 != (Literal *)0x0) {
          if (res->_cursor == res->_end) {
            ::Lib::Stack<Kernel::Literal_*>::expand(res);
          }
          *res->_cursor = pLVar3;
          res->_cursor = res->_cursor + 1;
        }
      }
      iVar6 = iVar6 + 2;
    } while (uVar4 < uVar5);
  }
  return;
}

Assistant:

void SAT2FO::collectAssignment(SATSolver& solver, LiteralStack& res) const
{
  // ASS_EQ(solver.getStatus(), SATSolver::SATISFIABLE);
  ASS(res.isEmpty());

  unsigned maxVar = maxSATVar();
  for (unsigned i = 1; i <= maxVar; i++) {
    SATSolver::VarAssignment asgn = solver.getAssignment(i);
    if(asgn==SATSolver::VarAssignment::DONT_CARE) {
      //we don't add DONT_CARE literals into the assignment
      continue;
    }
    ASS(asgn==SATSolver::VarAssignment::TRUE || asgn==SATSolver::VarAssignment::FALSE);
    SATLiteral sl(i, asgn==SATSolver::VarAssignment::TRUE);
    ASS(solver.trueInAssignment(sl));
    Literal* lit = toFO(sl);
    if(!lit) {
      //SAT literal doesn't have corresponding FO one
      continue;
    }
    res.push(lit);
  }
}